

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

void __thiscall
irr::scene::CSceneManager::CSceneManager
          (CSceneManager *this,IVideoDriver *driver,ICursorControl *cursorControl,IMeshCache *cache)

{
  array<irr::scene::IMeshLoader_*> *this_00;
  IMeshCache *pIVar1;
  CAttributes *this_01;
  CSceneCollisionManager *this_02;
  CB3DMeshFileLoader *pCVar2;
  vector3df local_58;
  vector3df local_48;
  vector3df local_38;
  
  *(undefined8 *)&this->field_0x248 = 0;
  *(undefined4 *)&this->field_0x250 = 1;
  (this->super_ISceneManager)._vptr_ISceneManager = (_func_int **)0x262bf8;
  *(undefined8 *)&this->field_0x240 = 0x262d40;
  local_58._0_8_ = (CB3DMeshFileLoader *)0x0;
  local_58.Z = 0.0;
  local_38.X = 0.0;
  local_38.Y = 0.0;
  local_38.Z = 0.0;
  local_48.X = 1.0;
  local_48.Y = 1.0;
  local_48.Z = 1.0;
  ISceneNode::ISceneNode
            ((ISceneNode *)&(this->super_ISceneManager).field_0x8,
             &PTR_construction_vtable_24__00262bc0,(ISceneNode *)0x0,(ISceneManager *)0x0,-1,
             &local_58,&local_38,&local_48);
  (this->super_ISceneManager)._vptr_ISceneManager = (_func_int **)0x2628f8;
  *(undefined8 *)&this->field_0x240 = 0x262b98;
  *(undefined8 *)&(this->super_ISceneManager).field_0x8 = 0x262a60;
  this->Driver = driver;
  this->CursorControl = cursorControl;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CameraList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CameraList).is_sorted = true;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SkyBoxList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SkyBoxList).is_sorted = true;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SolidNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SolidNodeList).is_sorted = true;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TransparentNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TransparentNodeList).is_sorted = true;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TransparentEffectNodeList).m_data.
  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TransparentEffectNodeList).is_sorted = true;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GuiNodeList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GuiNodeList).is_sorted = true;
  (this->MeshLoaderList).m_data.
  super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MeshLoaderList).m_data.
  super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MeshLoaderList).m_data.
  super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MeshLoaderList).is_sorted = true;
  (this->DeletionList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DeletionList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DeletionList).m_data.
  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DeletionList).is_sorted = true;
  this->ActiveCamera = (ICameraSceneNode *)0x0;
  (this->camWorldPos).X = 0.0;
  (this->camWorldPos).Y = 0.0;
  *(undefined8 *)&(this->camWorldPos).Z = 0x9600000000000000;
  (this->AmbientLight).r = 0.0;
  (this->AmbientLight).g = 0.0;
  (this->AmbientLight).b = 0.0;
  (this->AmbientLight).a = 0.0;
  this->Parameters = (CAttributes *)0x0;
  this->MeshCache = cache;
  this->CurrentRenderPass = ESNRP_NONE;
  *(CSceneManager **)&this->field_0xd0 = this;
  if (driver != (IVideoDriver *)0x0) {
    *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) =
         *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) + 1;
  }
  if (cursorControl != (ICursorControl *)0x0) {
    *(int *)(&cursorControl->field_0x10 + (long)cursorControl->_vptr_ICursorControl[-3]) =
         *(int *)(&cursorControl->field_0x10 + (long)cursorControl->_vptr_ICursorControl[-3]) + 1;
  }
  this_00 = &this->MeshLoaderList;
  if (cache == (IMeshCache *)0x0) {
    pIVar1 = (IMeshCache *)operator_new(0x40);
    *(undefined8 *)&pIVar1[1].field_0x10 = 0;
    *(undefined8 *)&pIVar1[1].field_0x18 = 0;
    pIVar1[1]._vptr_IMeshCache = (_func_int **)0x0;
    *(undefined8 *)&pIVar1[1].field_0x8 = 0;
    *(undefined4 *)&pIVar1[1].field_0x18 = 1;
    *(undefined ***)&pIVar1[1].field_0x8 = &PTR__IMeshCache_00263090;
    pIVar1->_vptr_IMeshCache = (_func_int **)0x262f28;
    *(undefined8 *)&pIVar1[1].field_0x8 = 0x262fb8;
    *(undefined8 *)&pIVar1->field_0x8 = 0;
    *(undefined8 *)&pIVar1->field_0x10 = 0;
    *(undefined8 *)&pIVar1->field_0x18 = 0;
    *(undefined1 *)&pIVar1[1]._vptr_IMeshCache = 1;
    this->MeshCache = pIVar1;
  }
  else {
    *(int *)(&cache->field_0x10 + (long)cache->_vptr_IMeshCache[-3]) =
         *(int *)(&cache->field_0x10 + (long)cache->_vptr_IMeshCache[-3]) + 1;
  }
  this_01 = (CAttributes *)operator_new(0x48);
  irr::io::CAttributes::CAttributes(this_01,(IVideoDriver *)0x0);
  this->Parameters = this_01;
  this_02 = (CSceneCollisionManager *)operator_new(0x30);
  CSceneCollisionManager::CSceneCollisionManager(this_02,&this->super_ISceneManager,this->Driver);
  this->CollisionManager = (ISceneCollisionManager *)this_02;
  pCVar2 = (CB3DMeshFileLoader *)operator_new(0xa8);
  CXMeshFileLoader::CXMeshFileLoader((CXMeshFileLoader *)pCVar2,&this->super_ISceneManager);
  local_58._0_8_ = pCVar2;
  ::std::vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>>::
  emplace_back<irr::scene::IMeshLoader*>
            ((vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>> *)this_00,
             (IMeshLoader **)&local_58);
  (this->MeshLoaderList).is_sorted = false;
  pCVar2 = (CB3DMeshFileLoader *)operator_new(0x48);
  COBJMeshFileLoader::COBJMeshFileLoader((COBJMeshFileLoader *)pCVar2,&this->super_ISceneManager);
  local_58._0_8_ = pCVar2;
  ::std::vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>>::
  emplace_back<irr::scene::IMeshLoader*>
            ((vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>> *)this_00,
             (IMeshLoader **)&local_58);
  (this->MeshLoaderList).is_sorted = false;
  pCVar2 = (CB3DMeshFileLoader *)operator_new(0xf8);
  CB3DMeshFileLoader::CB3DMeshFileLoader(pCVar2,&this->super_ISceneManager);
  local_58._0_8_ = pCVar2;
  ::std::vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>>::
  emplace_back<irr::scene::IMeshLoader*>
            ((vector<irr::scene::IMeshLoader*,std::allocator<irr::scene::IMeshLoader*>> *)this_00,
             (IMeshLoader **)&local_58);
  (this->MeshLoaderList).is_sorted = false;
  return;
}

Assistant:

CSceneManager::CSceneManager(video::IVideoDriver *driver,
		gui::ICursorControl *cursorControl, IMeshCache *cache) :
		ISceneNode(0, 0),
		Driver(driver),
		CursorControl(cursorControl),
		ActiveCamera(0), ShadowColor(150, 0, 0, 0), AmbientLight(0, 0, 0, 0), Parameters(0),
		MeshCache(cache), CurrentRenderPass(ESNRP_NONE)
{
#ifdef _DEBUG
	ISceneManager::setDebugName("CSceneManager ISceneManager");
	ISceneNode::setDebugName("CSceneManager ISceneNode");
#endif

	// root node's scene manager
	SceneManager = this;

	if (Driver)
		Driver->grab();

	if (CursorControl)
		CursorControl->grab();

	// create mesh cache if not there already
	if (!MeshCache)
		MeshCache = new CMeshCache();
	else
		MeshCache->grab();

	// set scene parameters
	Parameters = new io::CAttributes();

	// create collision manager
	CollisionManager = new CSceneCollisionManager(this, Driver);

	// add file format loaders. add the least commonly used ones first,
	// as these are checked last

	// TODO: now that we have multiple scene managers, these should be
	// shallow copies from the previous manager if there is one.

	MeshLoaderList.push_back(new CXMeshFileLoader(this));
	MeshLoaderList.push_back(new COBJMeshFileLoader(this));
	MeshLoaderList.push_back(new CB3DMeshFileLoader(this));
}